

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_1322f1::getIndex(char *pluralKeyword,UErrorCode *status)

{
  int iVar1;
  Form plural;
  UErrorCode *status_local;
  char *pluralKeyword_local;
  
  iVar1 = strcmp(pluralKeyword,"dnam");
  if (iVar1 == 0) {
    pluralKeyword_local._4_4_ = COUNT;
  }
  else {
    iVar1 = strcmp(pluralKeyword,"per");
    if (iVar1 == 0) {
      pluralKeyword_local._4_4_ = COUNT|ONE;
    }
    else {
      pluralKeyword_local._4_4_ = icu_63::StandardPlural::fromString(pluralKeyword,status);
    }
  }
  return pluralKeyword_local._4_4_;
}

Assistant:

static int32_t getIndex(const char* pluralKeyword, UErrorCode& status) {
    // pluralKeyword can also be "dnam" or "per"
    if (uprv_strcmp(pluralKeyword, "dnam") == 0) {
        return DNAM_INDEX;
    } else if (uprv_strcmp(pluralKeyword, "per") == 0) {
        return PER_INDEX;
    } else {
        StandardPlural::Form plural = StandardPlural::fromString(pluralKeyword, status);
        return plural;
    }
}